

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

bool __thiscall ON_PointCloud::Read(ON_PointCloud *this,ON_BinaryArchive *file)

{
  bool local_21;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_PointCloud *this_local;
  
  iStack_1c = 0;
  local_20 = 0;
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  local_21 = ON_BinaryArchive::Read3dmChunkVersion(file,&stack0xffffffffffffffe4,&local_20);
  if ((local_21) && (iStack_1c == 1)) {
    if (local_21) {
      local_21 = ON_BinaryArchive::ReadArray
                           (_minor_version,&(this->m_P).super_ON_SimpleArray<ON_3dPoint>);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadPlane(_minor_version,&this->m_plane);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadBoundingBox(_minor_version,&this->m_bbox);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_flags);
    }
    if ((local_21 != false) && (0 < local_20)) {
      if (local_21 != false) {
        local_21 = ON_BinaryArchive::ReadArray(_minor_version,&this->m_N);
      }
      if (local_21 != false) {
        local_21 = ON_BinaryArchive::ReadArray(_minor_version,&this->m_C);
      }
      if ((local_21 != false) && (1 < local_20)) {
        local_21 = ON_BinaryArchive::ReadArray(_minor_version,&this->m_V);
      }
    }
  }
  return local_21;
}

Assistant:

bool ON_PointCloud::Read( ON_BinaryArchive& file )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version == 1 ) 
  {
    if (rc) rc = file.ReadArray( m_P );
    if (rc) rc = file.ReadPlane( m_plane );
    if (rc) rc = file.ReadBoundingBox( m_bbox );
    if (rc) rc = file.ReadInt( &m_flags);

    if (rc && minor_version >= 1 )
    {
      if (rc) rc = file.ReadArray( m_N );
      if (rc) rc = file.ReadArray( m_C );
      if (rc && minor_version >= 2)
      {
        rc = file.ReadArray( m_V );
      }
    }
  }
  return rc;
}